

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

FunctionDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::FunctionDeclarationSyntax,slang::syntax::FunctionDeclarationSyntax_const&>
          (BumpAllocator *this,FunctionDeclarationSyntax *args)

{
  FunctionDeclarationSyntax *this_00;
  
  this_00 = (FunctionDeclarationSyntax *)allocate(this,0xb8,8);
  slang::syntax::FunctionDeclarationSyntax::FunctionDeclarationSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }